

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O0

S2Point * S2::FromFrame(S2Point *__return_storage_ptr__,Matrix3x3_d *m,S2Point *q)

{
  S2Point *q_local;
  Matrix3x3_d *m_local;
  
  Matrix3x3<double>::operator*(__return_storage_ptr__,m,q);
  return __return_storage_ptr__;
}

Assistant:

S2Point FromFrame(const Matrix3x3_d& m, const S2Point& q) {
  return m * q;
}